

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O1

Accel * __thiscall
embree::BVH4Factory::BVH4Quad4v
          (BVH4Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  long lVar1;
  int iVar2;
  BVHN<4> *this_00;
  undefined8 *puVar3;
  long *plVar4;
  Builder *pBVar5;
  Accel *pAVar6;
  long *plVar7;
  Intersectors intersectors;
  long *local_180;
  long local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  Intersectors local_140;
  
  this_00 = (BVHN<4> *)alignedMalloc(0x240,0x10);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&QuadMv<4>::type,scene);
  BVH4Quad4vIntersectors(&local_140,this,this_00,ivariant);
  iVar2 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0xf0));
  if (iVar2 == 0) {
    if (bvariant == STATIC) goto LAB_00c755e2;
    if (bvariant == DYNAMIC) goto LAB_00c755d1;
    if (bvariant != HIGH_QUALITY) {
      pBVar5 = (Builder *)0x0;
      goto LAB_00c755f4;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0xf0));
    if (iVar2 == 0) {
LAB_00c755e2:
      pBVar5 = (*this->BVH4Quad4vSceneBuilderSAH)(this_00,scene,0);
      goto LAB_00c755f4;
    }
    iVar2 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0xf0));
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare
                        ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0xf0));
      if (iVar2 != 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+(&local_160,"unknown builder ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0xf0));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_160);
        local_180 = (long *)*plVar4;
        plVar7 = plVar4 + 2;
        if (local_180 == plVar7) {
          local_170 = *plVar7;
          uStack_168 = (undefined4)plVar4[3];
          uStack_164 = *(undefined4 *)((long)plVar4 + 0x1c);
          local_180 = &local_170;
        }
        else {
          local_170 = *plVar7;
        }
        lVar1 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        *puVar3 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar3 + 1) = 2;
        puVar3[2] = puVar3 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar3 + 2),local_180,lVar1 + (long)local_180);
        __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
LAB_00c755d1:
      pBVar5 = (*this->BVH4BuilderTwoLevelQuadMeshSAH)(this_00,scene,false);
      goto LAB_00c755f4;
    }
  }
  pBVar5 = (*this->BVH4Quad4vSceneBuilderFastSpatialSAH)(this_00,scene,0);
LAB_00c755f4:
  pAVar6 = (Accel *)alignedMalloc(0x180,0x10);
  (pAVar6->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(pAVar6->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar6->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar6->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar6->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(pAVar6->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar6->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar6->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar6->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (pAVar6->super_AccelData).type = TY_ACCEL_INSTANCE;
  (pAVar6->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__RefCount_02207ae8;
  memcpy(&(pAVar6->super_AccelData).field_0x58,&local_140,0x118);
  (pAVar6->super_AccelData).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AccelInstance_02207a80;
  pAVar6[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  pAVar6[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pBVar5;
  return pAVar6;
}

Assistant:

Accel* BVH4Factory::BVH4Quad4v(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH4* accel = new BVH4(Quad4v::type,scene);
    Accel::Intersectors intersectors = BVH4Quad4vIntersectors(accel,ivariant);

    Builder* builder = nullptr;
    if (scene->device->quad_builder == "default") {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH4Quad4vSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : builder = BVH4BuilderTwoLevelQuadMeshSAH(accel,scene,false); break;
      case BuildVariant::HIGH_QUALITY: builder = BVH4Quad4vSceneBuilderFastSpatialSAH(accel,scene,0); break;
      }
    }
    else if (scene->device->quad_builder == "sah"              ) builder = BVH4Quad4vSceneBuilderSAH(accel,scene,0);
    else if (scene->device->quad_builder == "sah_fast_spatial" ) builder = BVH4Quad4vSceneBuilderFastSpatialSAH(accel,scene,0);
    else if (scene->device->quad_builder == "dynamic"          ) builder = BVH4BuilderTwoLevelQuadMeshSAH(accel,scene,false);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->quad_builder+" for BVH4<Quad4v>");

    return new AccelInstance(accel,builder,intersectors);
  }